

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmMakefile *mf)

{
  undefined8 uVar1;
  byte bVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_350;
  allocator local_32a;
  allocator local_329;
  string local_328;
  string local_308 [8];
  string args;
  string local_2e0;
  string local_2c0 [8];
  string make;
  undefined1 local_298 [8];
  cmGeneratedFileStream fout;
  allocator local_39;
  string local_38 [8];
  string filename;
  cmMakefile *mf_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = mf;
  pcVar3 = cmMakefile::GetHomeOutputDirectory(mf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar3,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,"/.kateproject");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,pcVar3,false);
  bVar2 = std::ios::operator!((ios *)(local_298 + (long)*(_func_int **)((long)local_298 + -0x18)));
  uVar1 = filename.field_2._8_8_;
  make.field_2._M_local_buf[0xc] = (bVar2 & 1) != 0;
  if (!(bool)make.field_2._M_local_buf[0xc]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2e0,"CMAKE_MAKE_PROGRAM",
               (allocator *)(args.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar1,&local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,pcVar3,(allocator *)(args.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(args.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)(args.field_2._M_local_buf + 0xf));
    uVar1 = filename.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_328,"CMAKE_KATE_MAKE_ARGUMENTS",&local_329);
    pcVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar1,&local_328);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,pcVar3,&local_32a);
    std::allocator<char>::~allocator((allocator<char> *)&local_32a);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    poVar4 = std::operator<<((ostream *)local_298,"{\n\t\"name\": \"");
    poVar4 = std::operator<<(poVar4,(string *)&this->ProjectName);
    poVar4 = std::operator<<(poVar4,"\",\n\t\"directory\": \"");
    pcVar3 = cmMakefile::GetHomeDirectory((cmMakefile *)filename.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_350,this,(cmMakefile *)filename.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)&local_350);
    std::operator<<(poVar4,"} ],\n");
    std::__cxx11::string::~string((string *)&local_350);
    WriteTargets(this,(cmMakefile *)filename.field_2._8_8_,(cmGeneratedFileStream *)local_298);
    std::operator<<((ostream *)local_298,"}\n");
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_2c0);
  }
  make.field_2._13_3_ = 0;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(const cmMakefile* mf) const
{
  std::string filename = mf->GetHomeOutputDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string args = mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");

  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << mf->GetHomeDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(mf) << "} ],\n";
  this->WriteTargets(mf, fout);
  fout << "}\n";
}